

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_internal_V2_annotation.cpp
# Opt level: O0

bool VectorAngle(ON_2dVector *v,double *angle)

{
  bool bVar1;
  double dVar2;
  double *angle_local;
  ON_2dVector *v_local;
  
  bVar1 = ON_2dVector::IsTiny(v,2.3283064365386963e-10);
  if (bVar1) {
    v_local._7_1_ = false;
  }
  else {
    dVar2 = atan2(v->y,v->x);
    *angle = dVar2;
    if (*angle <= 0.0 && *angle != 0.0) {
      *angle = *angle + 6.283185307179586;
    }
    if (6.283185307179586 < *angle) {
      *angle = *angle - 6.283185307179586;
    }
    v_local._7_1_ = true;
  }
  return v_local._7_1_;
}

Assistant:

static bool VectorAngle( const ON_2dVector& v, double& angle)
{
  if( v.IsTiny())
    return false;

  angle = atan2( v.y, v.x);

  if( angle < 0.0)
    angle += 2.0 * ON_PI;

  if( angle > 2.0 * ON_PI)
    angle -= 2.0 * ON_PI;

  return true;
}